

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

int __thiscall Lodtalk::StackInterpreterProxy::returnTop(StackInterpreterProxy *this)

{
  StackInterpreter *this_00;
  StackMemory *pSVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 value;
  
  this_00 = this->interpreter;
  pSVar1 = this_00->stack;
  paVar2 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(pSVar1->stackFrame).stackPointer;
  value = *paVar2;
  (pSVar1->stackFrame).stackPointer = (uint8_t *)(paVar2 + 1);
  StackInterpreter::returnValue(this_00,(Oop)value);
  return 0;
}

Assistant:

int StackInterpreterProxy::returnTop()
{
    interpreter->returnTop();
    return 0;
}